

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O3

Result __thiscall wabt::TypeChecker::OnSelect(TypeChecker *this,Type expected)

{
  bool bVar1;
  Result RVar2;
  Result RVar3;
  Result RVar4;
  Result RVar5;
  Result RVar6;
  Type TVar7;
  Type args;
  Type type2;
  Type type1;
  undefined8 local_38;
  
  local_38 = 0;
  RVar2 = PeekAndCheckType(this,0,(Type)0xffffffff);
  RVar3 = PeekType(this,1,(Type *)((long)&local_38 + 4));
  RVar4 = PeekType(this,2,(Type *)&local_38);
  TVar7.enum_ = local_38._4_4_;
  if (expected.enum_ == Any) {
    bVar1 = true;
    if (((uint)(local_38._4_4_ + ~(Func|I32U)) < 0x1b) &&
       (args.enum_ = Any, (0x40001c1U >> (local_38._4_4_ + ~(Func|I32U) & 0x1fU) & 1) != 0))
    goto LAB_00163883;
    if (((uint)(local_38._0_4_ + ~(Func|I32U)) < 0x1b) &&
       (args.enum_ = Any, (0x40001c1U >> (local_38._0_4_ + ~(Func|I32U) & 0x1fU) & 1) != 0))
    goto LAB_00163883;
    RVar5 = CheckType(local_38._4_4_,local_38._0_4_);
    bVar1 = RVar5.enum_ == Error;
  }
  else {
    RVar5 = CheckType(local_38._4_4_,expected);
    RVar6 = CheckType(local_38._0_4_,expected);
    bVar1 = RVar6.enum_ == Error || RVar5.enum_ == Error;
    TVar7.enum_ = Any;
  }
  bVar1 = (RVar4.enum_ == Error || (RVar3.enum_ == Error || RVar2.enum_ == Error)) || bVar1;
  args.enum_ = TVar7.enum_;
LAB_00163883:
  RVar2.enum_._1_3_ = 0;
  RVar2.enum_._0_1_ = bVar1;
  PrintStackIfFailed<wabt::Type,wabt::Type,wabt::Type::Enum>(this,RVar2,"select",args,args,I32);
  RVar2 = DropTypes(this,3);
  PushType(this,args);
  return (Result)(uint)(byte)(bVar1 | RVar2.enum_ == Error);
}

Assistant:

Result TypeChecker::OnSelect(Type expected) {
  Result result = Result::Ok;
  Type type1 = Type::Any;
  Type type2 = Type::Any;
  Type result_type = Type::Any;
  result |= PeekAndCheckType(0, Type::I32);
  result |= PeekType(1, &type1);
  result |= PeekType(2, &type2);
  if (expected == Type::Any) {
    if (type1.IsRef() || type2.IsRef()) {
      result = Result::Error;
    } else {
      result |= CheckType(type1, type2);
      result_type = type1;
    }
  } else {
    result |= CheckType(type1, expected);
    result |= CheckType(type2, expected);
  }
  PrintStackIfFailed(result, "select", result_type, result_type, Type::I32);
  result |= DropTypes(3);
  PushType(result_type);
  return result;
}